

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

int soplex::totalSizeRational(Rational *vector,int length,int base)

{
  int in_ESI;
  long in_RDI;
  int i;
  int size;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_ffffffffffffff90;
  undefined1 local_68 [64];
  int local_28;
  int local_24;
  int local_1c;
  long local_18;
  long local_10;
  undefined1 *local_8;
  
  local_24 = 0;
  local_1c = in_ESI;
  local_18 = in_RDI;
  for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
    local_10 = local_18 + (long)local_28 * 0x40;
    local_8 = local_68;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor(in_stack_ffffffffffffff90,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    in_stack_ffffffffffffff88 = sizeInBase(vector,length);
    local_24 = in_stack_ffffffffffffff88 + local_24;
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x44f256);
  }
  return local_24;
}

Assistant:

inline int totalSizeRational(const Rational* vector, const int length, const int base)
{
   assert(vector != nullptr);
   assert(length >= 0);
   assert(base >= 0);

   int size = 0;

   for(int i = 0; i < length; i++)
      size += sizeInBase(vector[i], base);

   return size;
}